

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

bool __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
          (Image<float,_gimage::PixelTraits<float>_> *this,long i,long k)

{
  bool bVar1;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  int j;
  store_t_conflict in_stack_ffffffffffffffcc;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (in_RDI->depth <= local_24) {
      return true;
    }
    bVar1 = isValidS(in_RDI,in_stack_ffffffffffffffcc);
    if (!bVar1) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool isValid(long i, long k) const
    {
      for (int j=0; j<depth; j++)
      {
        if (!isValidS(img[j][k][i]))
        {
          return false;
        }
      }

      return true;
    }